

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_AfterProtocMaximumEditionAllowlisted_Test::
~CommandLineInterfaceTest_AfterProtocMaximumEditionAllowlisted_Test
          (CommandLineInterfaceTest_AfterProtocMaximumEditionAllowlisted_Test *this)

{
  CommandLineInterfaceTest_AfterProtocMaximumEditionAllowlisted_Test *this_local;
  
  ~CommandLineInterfaceTest_AfterProtocMaximumEditionAllowlisted_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, AfterProtocMaximumEditionAllowlisted) {
  constexpr absl::string_view path = "google/protobuf";
  CreateTempFile(absl::StrCat(path, "/foo.proto"),
                 R"schema(
    edition = "2024";
    package foo;
    message Foo {
    }
  )schema");

  Run(
      absl::Substitute("protocol_compiler --proto_path=$$tmpdir "
                       "--test_out=$$tmpdir $0/foo.proto",
                       path));
  ExpectNoErrors();
}